

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O1

void connection_fail(uv_connect_cb connect_cb)

{
  int iVar1;
  uv_loop_t *puVar2;
  int iVar3;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in server_addr;
  sockaddr_in client_addr;
  long lStack_68;
  long lStack_60;
  uv_connect_cb p_Stack_58;
  undefined8 uStack_48;
  code *pcStack_40;
  long local_38;
  long local_30;
  sockaddr_in local_28;
  sockaddr_in local_18;
  
  pcStack_40 = (code *)0x180a24;
  iVar1 = uv_ip4_addr("0.0.0.0",0,&local_18);
  local_28._0_8_ = SEXT48(iVar1);
  local_38 = 0;
  if (local_28._0_8_ == 0) {
    pcStack_40 = (code *)0x180a58;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_28);
    local_38 = (long)iVar1;
    local_30 = 0;
    if (local_38 != 0) goto LAB_00180b42;
    pcStack_40 = (code *)0x180a7b;
    puVar2 = uv_default_loop();
    pcStack_40 = (code *)0x180a8a;
    iVar1 = uv_tcp_init(puVar2,&tcp);
    if (iVar1 != 0) goto LAB_00180b4f;
    pcStack_40 = (code *)0x180aa5;
    iVar1 = uv_tcp_bind(&tcp,(sockaddr *)&local_18,0);
    local_38 = (long)iVar1;
    local_30 = 0;
    if (local_38 != 0) goto LAB_00180b54;
    pcStack_40 = (code *)0x180ade;
    iVar1 = uv_tcp_connect(&req,&tcp,(sockaddr *)&local_28,connect_cb);
    if (iVar1 != 0) goto LAB_00180b61;
    pcStack_40 = (code *)0x180ae7;
    puVar2 = uv_default_loop();
    pcStack_40 = (code *)0x180af1;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_38 = 1;
    local_30 = (long)connect_cb_calls;
    if (local_30 != 1) goto LAB_00180b66;
    local_38 = 1;
    local_30 = (long)close_cb_calls;
    if (local_30 == 1) {
      return;
    }
  }
  else {
    pcStack_40 = (code *)0x180b42;
    connection_fail_cold_1();
LAB_00180b42:
    pcStack_40 = (code *)0x180b4f;
    connection_fail_cold_2();
LAB_00180b4f:
    pcStack_40 = (code *)0x180b54;
    connection_fail_cold_3();
LAB_00180b54:
    pcStack_40 = (code *)0x180b61;
    connection_fail_cold_4();
LAB_00180b61:
    pcStack_40 = (code *)0x180b66;
    connection_fail_cold_5();
LAB_00180b66:
    pcStack_40 = (code *)0x180b73;
    connection_fail_cold_6();
  }
  plVar4 = &local_38;
  iVar1 = (int)&local_30;
  pcStack_40 = on_connect_with_close;
  connection_fail_cold_7();
  if (*(uv_tcp_t **)((long)plVar4 + 0x50) == &tcp) {
    pcStack_40 = (code *)(long)iVar1;
    uStack_48 = 0xffffffffffffff91;
    if (pcStack_40 != (code *)0xffffffffffffff91) goto LAB_00180bed;
    connect_cb_calls = connect_cb_calls + 1;
    pcStack_40 = (code *)(long)close_cb_calls;
    uStack_48 = 0;
    if (pcStack_40 == (code *)0x0) {
      uv_close((uv_handle_t *)&tcp,on_close);
      return;
    }
  }
  else {
    p_Stack_58 = (uv_connect_cb)0x180bed;
    on_connect_with_close_cold_1();
LAB_00180bed:
    p_Stack_58 = (uv_connect_cb)0x180bfc;
    on_connect_with_close_cold_2();
  }
  p_Stack_58 = run_test_connection_fail_doesnt_auto_close;
  on_connect_with_close_cold_3();
  iVar3 = (int)&lStack_68;
  p_Stack_58 = connect_cb;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  lStack_60 = (long)iVar1;
  lStack_68 = 0;
  if (lStack_60 == 0) {
    connection_fail(on_connect_without_close);
    lStack_60 = 1;
    lStack_68 = (long)timer_close_cb_calls;
    if (lStack_68 != 1) goto LAB_00180cf4;
    lStack_60 = 1;
    lStack_68 = (long)timer_cb_calls;
    if (lStack_68 == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      lStack_60 = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      lStack_68 = (long)iVar1;
      if (lStack_60 == lStack_68) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00180d0e;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_00180cf4:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_00180d0e:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return;
}

Assistant:

static void connection_fail(uv_connect_cb connect_cb) {
  struct sockaddr_in client_addr, server_addr;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &client_addr));

  /* There should be no servers listening on this port. */
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway. so these
   * handles can be pre-initialized. */
  ASSERT_OK(uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0));

  r = uv_tcp_connect(&req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT(!r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, connect_cb_calls);
  ASSERT_EQ(1, close_cb_calls);
}